

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O0

UnicodeString * icu_63::tokenString(UnicodeString *__return_storage_ptr__,tokenType tok)

{
  tokenType tok_local;
  UnicodeString *s;
  
  UnicodeString::UnicodeString(__return_storage_ptr__);
  switch(tok) {
  case tVariableN:
    UnicodeString::append(__return_storage_ptr__,L'n');
    break;
  case tVariableI:
    UnicodeString::append(__return_storage_ptr__,L'i');
    break;
  case tVariableF:
    UnicodeString::append(__return_storage_ptr__,L'f');
    break;
  case tVariableV:
    UnicodeString::append(__return_storage_ptr__,L'v');
    break;
  case tVariableT:
    UnicodeString::append(__return_storage_ptr__,L't');
    break;
  default:
    UnicodeString::append(__return_storage_ptr__,L'~');
  }
  return __return_storage_ptr__;
}

Assistant:

static UnicodeString tokenString(tokenType tok) {
    UnicodeString s;
    switch (tok) {
      case tVariableN:
        s.append(LOW_N); break;
      case tVariableI:
        s.append(LOW_I); break;
      case tVariableF:
        s.append(LOW_F); break;
      case tVariableV:
        s.append(LOW_V); break;
      case tVariableT:
        s.append(LOW_T); break;
      default:
        s.append(TILDE);
    }
    return s;
}